

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O3

bool __thiscall Nova::Parse_Args::Is_Value_Set(Parse_Args *this,string *arg_str)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = Find_Match(this,arg_str);
  if (-1 < (int)uVar1) {
    return (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar1].value_set;
  }
  poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,"Argument ");
  poVar2 = std::operator<<(poVar2,(string *)arg_str);
  poVar2 = std::operator<<(poVar2," undeclared");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

bool Parse_Args::
Is_Value_Set(const std::string& arg_str) const
{
    int match=Find_Match(arg_str);
    if(match<0)
    {
        Log::cerr<<"Argument "<<arg_str<<" undeclared"<<std::endl;
        exit(-1);
    }
    return arg_data_list[match].value_set;
}